

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O3

int match_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
              int *longindex)

{
  int iVar1;
  size_t __n;
  parg_option *ppVar2;
  char *__s2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int local_60;
  
  pcVar3 = ps->nextchar;
  __n = strcspn(pcVar3,"=");
  __s2 = longopts->name;
  if (__s2 == (char *)0x0) {
LAB_0010a3c6:
    ps->optopt = 0;
    ps->nextchar = (char *)0x0;
    return 0x3f;
  }
  ppVar2 = longopts + 1;
  local_60 = -1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar1 = strncmp(pcVar3,__s2,__n);
    if (iVar1 == 0) {
      if (__s2[__n] == '\0') goto LAB_0010a3ee;
      iVar5 = iVar5 + 1;
      local_60 = iVar4;
    }
    __s2 = ppVar2->name;
    iVar4 = iVar4 + 1;
    ppVar2 = ppVar2 + 1;
  } while (__s2 != (char *)0x0);
  if (iVar5 != 1) goto LAB_0010a3c6;
  iVar4 = local_60;
  if (local_60 == -1) {
    __assert_fail("match != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0x67
                  ,
                  "int match_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
LAB_0010a3ee:
  if (longindex != (int *)0x0) {
    *longindex = iVar4;
  }
  if (pcVar3[__n] == '=') {
    if (longopts[iVar4].has_arg == 0) {
LAB_0010a45b:
      iVar5 = 0;
      if (longopts[iVar4].flag == (int *)0x0) {
        iVar5 = longopts[iVar4].val;
      }
      ps->optopt = iVar5;
      ps->nextchar = (char *)0x0;
      return (uint)(*optstring != ':') * 5 + 0x3a;
    }
    pcVar3 = pcVar3 + __n + 1;
  }
  else {
    if (longopts[iVar4].has_arg != 1) goto LAB_0010a43f;
    iVar5 = ps->optind;
    if ((argc <= iVar5) || (pcVar3 = argv[iVar5], pcVar3 == (char *)0x0)) goto LAB_0010a45b;
    ps->optind = iVar5 + 1;
  }
  ps->optarg = pcVar3;
LAB_0010a43f:
  ps->nextchar = (char *)0x0;
  if (longopts[iVar4].flag == (int *)0x0) {
    return longopts[iVar4].val;
  }
  *longopts[iVar4].flag = longopts[iVar4].val;
  return 0;
}

Assistant:

static int
match_long(struct parg_state *ps, int argc, char *const argv[],
           const char *optstring,
           const struct parg_option *longopts, int *longindex)
{
	size_t len;
	int num_match = 0;
	int match = -1;
	int i;

	len = strcspn(ps->nextchar, "=");

	for (i = 0; longopts[i].name; ++i) {
		if (strncmp(ps->nextchar, longopts[i].name, len) == 0) {
			match = i;
			num_match++;
			/* Take if exact match */
			if (longopts[i].name[len] == '\0') {
				num_match = 1;
				break;
			}
		}
	}

	/* Return '?' on no or ambiguous match */
	if (num_match != 1) {
		ps->optopt = 0;
		ps->nextchar = NULL;
		return '?';
	}

	assert(match != -1);

	if (longindex) {
		*longindex = match;
	}

	if (ps->nextchar[len] == '=') {
		/* Option argument present, check if extraneous */
		if (longopts[match].has_arg == PARG_NOARG) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}
		else {
			ps->optarg = &ps->nextchar[len + 1];
		}
	}
	else if (longopts[match].has_arg == PARG_REQARG) {
		/* Option argument required, so return next argv element */
		if (is_argv_end(ps, argc, argv)) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}

		ps->optarg = argv[ps->optind++];
	}

	ps->nextchar = NULL;

	if (longopts[match].flag != NULL) {
		*longopts[match].flag = longopts[match].val;
		return 0;
	}

	return longopts[match].val;
}